

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

int __thiscall CVmImagePool::init(CVmImagePool *this,EVP_PKEY_CTX *ctx)

{
  size_t __size;
  int iVar1;
  CVmImagePool_pg **__s;
  CVmImagePool_pg *pCVar3;
  ulong in_RCX;
  ulong in_RDX;
  ulong uVar4;
  ulong uVar5;
  void *pvVar2;
  
  this->page_count_ = in_RDX;
  this->page_size_ = in_RCX;
  this->fp_ = (CVmImageFile *)ctx;
  if (this->page_info_ != (CVmImagePool_pg **)0x0) {
    err_throw(0x138);
  }
  uVar4 = in_RDX + 0xfff >> 0xc;
  __size = uVar4 * 8;
  __s = (CVmImagePool_pg **)malloc(__size);
  this->page_info_ = __s;
  if (__s != (CVmImagePool_pg **)0x0) {
    pvVar2 = memset(__s,0,__size);
    iVar1 = (int)pvVar2;
    if (0xfff < in_RDX + 0xfff) {
      uVar5 = 0;
      do {
        pCVar3 = (CVmImagePool_pg *)malloc(0x18000);
        this->page_info_[uVar5] = pCVar3;
        if (this->page_info_[uVar5] == (CVmImagePool_pg *)0x0) goto LAB_0029eed2;
        pvVar2 = memset(this->page_info_[uVar5],0,0x18000);
        iVar1 = (int)pvVar2;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    return iVar1;
  }
LAB_0029eed2:
  err_throw(0xca);
}

Assistant:

void CVmImagePool::init(CVmImageFile *fp, ulong page_count, ulong page_size)
{
    size_t cnt;
    size_t i;

    /* remember the page count and page size */
    page_count_ = page_count;
    page_size_ = page_size;

    /* remember the underlying image file */
    fp_ = fp;

    /* if this pool has already been defined, throw an error */
    if (page_info_ != 0)
        err_throw(VMERR_IMAGE_POOL_REDEF);
    
    /* 
     *   Allocate the main page array.  We need one entry for each
     *   subarray, so figure the subarray count and allocate the
     *   appropriate amount of space.  
     */
    cnt = get_subarray_count();
    page_info_ = (CVmImagePool_pg **)t3malloc(cnt * sizeof(page_info_[0]));

    /* throw an error if that failed */
    if (page_info_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* clear the array */
    memset(page_info_, 0, cnt * sizeof(page_info_[0]));

    /* allocate the subarrays */
    for (i = 0 ; i < cnt ; ++i)
    {
        /* allocate this page, which contains file offsets */
        page_info_[i] =
            (CVmImagePool_pg *)t3malloc(VMIMAGE_POOL_SUBARRAY_SIZE
                                        * sizeof(page_info_[i][0]));

        /* throw an error if that failed */
        if (page_info_[i] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* clear the memory */
        memset(page_info_[i], 0,
               VMIMAGE_POOL_SUBARRAY_SIZE * sizeof(page_info_[i][0]));
    }
}